

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

void rw::ps2::printTEX1(uint64 tex1)

{
  printf("%016lX ",tex1);
  printf("LCM:%X MXL:%X MMAG:%X MMIN:%X MTBA:%X L:%X K:%X\n",tex1 & 1,(ulong)((uint)(tex1 >> 2) & 7)
         ,(ulong)((uint)(tex1 >> 5) & 1),(ulong)((uint)(tex1 >> 6) & 7),
         (ulong)((uint)(tex1 >> 9) & 1),(ulong)((uint)(tex1 >> 0x13) & 3),
         (tex1 & 0xfff00000001) >> 0x20);
  return;
}

Assistant:

void
printTEX1(uint64 tex1)
{
	printf("%016lX ", tex1);
	uint32 lcm = tex1 & 0x1; tex1 >>= 2;
	uint32 mxl = tex1 & 0x7; tex1 >>= 3;
	uint32 mmag = tex1 & 0x1; tex1 >>= 1;
	uint32 mmin = tex1 & 0x7; tex1 >>= 3;
	uint32 mtba = tex1 & 0x1; tex1 >>= 10;
	uint32 l = tex1 & 0x3; tex1 >>= 13;
	uint32 k = tex1 & 0xFFF;
	printf("LCM:%X MXL:%X MMAG:%X MMIN:%X MTBA:%X L:%X K:%X\n",
		lcm, mxl, mmag, mmin, mtba, l, k);
}